

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Matrix<double> * __thiscall
nnad::Matrix<double>::operator*(Matrix<double> *this,Matrix<double> *term)

{
  int iVar1;
  int iVar2;
  Matrix<double> *in_RDX;
  int *in_RSI;
  Matrix<double> *in_RDI;
  int k;
  double value;
  int j;
  int i;
  int c2;
  int l2;
  int c1;
  int l1;
  Matrix<double> *result;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  int *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  undefined4 in_stack_ffffffffffffff98;
  int iVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  allocator<char> local_49;
  string local_48 [8];
  int *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  Matrix<double> *in_stack_ffffffffffffffd0;
  int iVar6;
  int iVar7;
  
  iVar7 = *in_RSI;
  iVar6 = in_RSI[1];
  iVar1 = GetLines(in_RDX);
  iVar2 = GetColumns(in_RDX);
  if (iVar6 != iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    Error((string *)0x1116a9);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  Matrix((Matrix<double> *)
         (CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) & 0xffffffff00ffffff),
         (int *)CONCAT44(0xffffffff,in_stack_ffffffffffffff98),
         (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
         in_stack_ffffffffffffff88);
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar4 < iVar7; iVar4 = iVar4 + 1) {
      for (iVar3 = 0; iVar3 < iVar6; iVar3 = iVar3 + 1) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RSI + 2),
                   (long)(iVar4 * in_RSI[1] + iVar3));
        GetElement(in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8,
                   in_stack_ffffffffffffffc0);
      }
      SetElement((Matrix<double> *)CONCAT44(iVar7,iVar6),(int *)CONCAT44(iVar1,iVar2),
                 &in_stack_ffffffffffffffd0->_Lines,in_stack_ffffffffffffffc8);
    }
  }
  return in_RDI;
}

Assistant:

Matrix<T> operator * (Matrix<T> const& term) const
    {
      const int l1 = _Lines;
      const int c1 = _Columns;
      const int l2 = term.GetLines();
      const int c2 = term.GetColumns();
      if (c1 != l2)
        Error("Lines or Columns don't match multiplying the two matrices.");

      Matrix result{l1, c2};
      for (int i = 0; i < c2; i++)
        for (int j = 0; j < l1; j++)
          {
            T value = T(0);
            for (int k = 0; k < c1; k++)
              value += _Matrix[j * _Columns + k] * term.GetElement(k, i);

            result.SetElement(j, i, value);
          }

      return result;
    }